

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu.cpp
# Opt level: O0

void __thiscall MMU::MMU(MMU *this)

{
  MMU *this_local;
  
  this->enabled = 0;
  this->nsets = 1;
  this->nways = 1;
  this->pagesize = 0x2000;
  this->entrysize = 1;
  this->ustates = 2;
  this->hitdelay = 1;
  this->missdelay = 1;
  return;
}

Assistant:

MMU::MMU()
{
    enabled = 0;
    nsets = 1;
    nways = 1;
    pagesize = 8192;
    entrysize = 1; /* Not currently used */
    ustates = 2;
    hitdelay = 1;
    missdelay = 1;
}